

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cache.c
# Opt level: O0

void ZopfliSublenToCache(unsigned_short *sublen,size_t pos,size_t length,
                        ZopfliLongestMatchCache *lmc)

{
  uchar *puVar1;
  char cVar2;
  uchar *cache;
  uint bestlength;
  size_t j;
  size_t i;
  ZopfliLongestMatchCache *lmc_local;
  size_t length_local;
  size_t pos_local;
  unsigned_short *sublen_local;
  
  j = 0;
  bestlength = 0;
  puVar1 = lmc->sublen;
  if (2 < length) {
    for (i = 3; cVar2 = (char)bestlength, i <= length; i = i + 1) {
      if ((i == length) || (sublen[i] != sublen[i + 1])) {
        puVar1[j * 3 + pos * 0x18] = (char)i + 0xfd;
        puVar1[j * 3 + pos * 0x18 + 1] = (uchar)((ulong)sublen[i] % 0x100);
        puVar1[j * 3 + pos * 0x18 + 2] = (uchar)((ulong)(uint)((int)(uint)sublen[i] >> 8) % 0x100);
        bestlength = (uint)i;
        j = j + 1;
        cVar2 = (char)i;
        if (7 < j) break;
      }
    }
    bestlength._0_1_ = cVar2;
    if (j < 8) {
      puVar1[pos * 0x18 + 0x15] = (char)bestlength + 0xfd;
    }
  }
  return;
}

Assistant:

void ZopfliSublenToCache(const unsigned short* sublen,
                         size_t pos, size_t length,
                         ZopfliLongestMatchCache* lmc) {
  size_t i;
  size_t j = 0;
  unsigned bestlength = 0;
  unsigned char* cache;

#if ZOPFLI_CACHE_LENGTH == 0
  return;
#endif

  cache = &lmc->sublen[ZOPFLI_CACHE_LENGTH * pos * 3];
  if (length < 3) return;
  for (i = 3; i <= length; i++) {
    if (i == length || sublen[i] != sublen[i + 1]) {
      cache[j * 3] = i - 3;
      cache[j * 3 + 1] = sublen[i] % 256;
      cache[j * 3 + 2] = (sublen[i] >> 8) % 256;
      bestlength = i;
      j++;
      if (j >= ZOPFLI_CACHE_LENGTH) break;
    }
  }
  if (j < ZOPFLI_CACHE_LENGTH) {
    assert(bestlength == length);
    cache[(ZOPFLI_CACHE_LENGTH - 1) * 3] = bestlength - 3;
  } else {
    assert(bestlength <= length);
  }
  assert(bestlength == ZopfliMaxCachedSublen(lmc, pos, length));
}